

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

void __thiscall mjs::anon_unknown_46::stringify_state::~stringify_state(stringify_state *this)

{
  uint32_t uVar1;
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *this_00;
  
  if ((this->stack_).super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
    this_00 = (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *)
              gc_heap_ptr_untyped::get(&(this->stack_).super_gc_heap_ptr_untyped);
    uVar1 = gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::length(this_00);
    if (uVar1 != 0) {
      __assert_fail("!stack_ || stack_->length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x202,"mjs::(anonymous namespace)::stringify_state::~stringify_state()");
    }
  }
  std::__cxx11::wstring::~wstring((wstring *)&this->gap_);
  std::__cxx11::wstring::~wstring((wstring *)&this->indent_);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->property_names_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->replacer_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->stack_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  return;
}

Assistant:

~stringify_state() {
        assert(!stack_ || stack_->length() == 0);
    }